

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_get_noise_bits(fitsfile *fptr,int *noisebits,int *status)

{
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  double dVar1;
  double dVar2;
  double qlevel;
  
  dVar1 = (double)*(float *)(*(long *)(in_RDI + 8) + 0x420);
  if ((dVar1 <= 0.0) || (65537.0 <= dVar1)) {
    *in_RSI = 0;
  }
  else {
    dVar1 = log(dVar1);
    dVar2 = log(2.0);
    *in_RSI = (int)(dVar1 / dVar2 + 0.5);
  }
  return *in_RDX;
}

Assistant:

int fits_get_noise_bits(fitsfile *fptr,  /* I - FITS file pointer   */
           int *noisebits,       /* noise_bits parameter value       */
                                /* (default = 4)                    */
           int *status)         /* IO - error status                */
{
/*
   ********************************************************************
   ********************************************************************
   THIS ROUTINE IS PROVIDED ONLY FOR BACKWARDS COMPATIBILITY;
   ALL NEW SOFTWARE SHOULD CALL fits_set_quantize_level INSTEAD
   ********************************************************************
   ********************************************************************


   This routine returns the value of the noice_bits parameter that
   should be used when compressing floating point images.  The image is
   divided into tiles, and each tile is compressed and stored in a row
   of at variable length binary table column.

   Feb 2008: code changed to use the more general "quantize level" parameter
   rather than the "noise bits" parameter.  If quantize level is greater than
   zero, then the previous noisebits parameter is approximately given by
   
   noise bits = natural logarithm (quantize level) / natural log (2)
   
   This result is rounded to the nearest integer.
*/
    double qlevel;

    qlevel = (fptr->Fptr)->request_quantize_level;

    if (qlevel > 0. && qlevel < 65537. )
         *noisebits =  (int) ((log(qlevel) / log(2.0)) + 0.5);
    else 
        *noisebits = 0;

    return(*status);
}